

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O2

int lws_check_utf8(uchar *state,uchar *buf,size_t len)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  byte *pbVar5;
  uint uVar6;
  
  pbVar5 = state;
  do {
    lVar3 = -len;
    bVar2 = *pbVar5;
    pbVar5 = buf;
    do {
      while( true ) {
        lVar3 = lVar3 + 1;
        buf = pbVar5 + 1;
        if (lVar3 == 1) {
          *state = bVar2;
          return 0;
        }
        bVar1 = *pbVar5;
        uVar4 = (uint)bVar1;
        if (bVar2 != 0) {
          uVar6 = bVar2 & 0xfffffff0;
          if (uVar4 < uVar6) {
            return 1;
          }
          if (uVar6 + (bVar2 & 0xc) * 4 + 0x10 <= uVar4) {
            return 1;
          }
          uVar4 = (bVar2 & 3) + 0x15;
          goto LAB_0010ea1a;
        }
        pbVar5 = buf;
        if ((char)bVar1 < '\0') break;
        bVar2 = 0;
      }
      if ((byte)(bVar1 + 0xb) < 0xcd) {
        return 1;
      }
      bVar2 = 0x8c;
    } while (bVar1 < 0xe0);
    uVar4 = uVar4 & 0x1f;
LAB_0010ea1a:
    pbVar5 = e0f4 + uVar4;
    len = -lVar3;
  } while( true );
}

Assistant:

int
lws_check_utf8(unsigned char *state, unsigned char *buf, size_t len)
{
	unsigned char s = *state;

	while (len--) {
		unsigned char c = *buf++;

		if (!s) {
			if (c >= 0x80) {
				if (c < 0xc2 || c > 0xf4)
					return 1;
				if (c < 0xe0)
					s = 0x80 | ((4 - 1) << 2);
				else
					s = e0f4[c - 0xe0];
			}
		} else {
			if (c < (s & 0xf0) ||
			    c >= (s & 0xf0) + 0x10 + ((s << 2) & 0x30))
				return 1;
			s = e0f4[21 + (s & 3)];
		}
	}

	*state = s;

	return 0;
}